

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_builder.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::MessageBuilderGenerator::GenerateBuilderPackedFieldParsingCase
          (MessageBuilderGenerator *this,Printer *printer,FieldDescriptor *field)

{
  ImmutableFieldGenerator *pIVar1;
  AlphaNum *a;
  string_view text;
  string_view text_00;
  string tagString;
  AlphaNum local_58;
  
  absl::lts_20250127::AlphaNum::AlphaNum(&local_58,field->number_ * 8 + 2);
  absl::lts_20250127::StrCat_abi_cxx11_(&tagString,(lts_20250127 *)&local_58,a);
  text._M_str = "case $tag$: {\n";
  text._M_len = 0xe;
  io::Printer::Print<char[4],std::__cxx11::string>(printer,text,(char (*) [4])0x101e26c,&tagString);
  printer->indent_ = printer->indent_ + (printer->options_).spaces_per_indent;
  pIVar1 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::get
                     (&this->field_generators_,field);
  (*(pIVar1->super_FieldGenerator)._vptr_FieldGenerator[0x11])(pIVar1,printer);
  io::Printer::Outdent(printer);
  text_00._M_str = "  break;\n} // case $tag$\n";
  text_00._M_len = 0x19;
  io::Printer::Print<char[4],std::__cxx11::string>
            (printer,text_00,(char (*) [4])0x101e26c,&tagString);
  std::__cxx11::string::~string((string *)&tagString);
  return;
}

Assistant:

void MessageBuilderGenerator::GenerateBuilderPackedFieldParsingCase(
    io::Printer* printer, const FieldDescriptor* field) {
  // To make packed = true wire compatible, we generate parsing code from a
  // packed version of this field regardless of field->options().packed().
  uint32_t tag = WireFormatLite::MakeTag(
      field->number(), WireFormatLite::WIRETYPE_LENGTH_DELIMITED);
  std::string tagString = absl::StrCat(static_cast<int32_t>(tag));
  printer->Print("case $tag$: {\n", "tag", tagString);
  printer->Indent();

  field_generators_.get(field).GenerateBuilderParsingCodeFromPacked(printer);

  printer->Outdent();
  printer->Print(
      "  break;\n"
      "} // case $tag$\n",
      "tag", tagString);
}